

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_LT_Test::Body(iu_SyntaxTest_x_iutest_x_LT_Test *this)

{
  return;
}

Assistant:

IUTEST(SyntaxTest, LT)
{
    if( int x = 1 )
        IUTEST_ASSERT_LT(0, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_LT(0, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_LT(0, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_LT(0, x) << x;
}